

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O2

bool duckdb::PhysicalOperator::OperatorCachingAllowed(ExecutionContext *context)

{
  bool bVar1;
  Pipeline *pPVar2;
  PhysicalOperator *pPVar3;
  optional_ptr<duckdb::Pipeline,_true> *this;
  OperatorPartitionInfo partition_info;
  optional_ptr<duckdb::PhysicalOperator,_true> local_30;
  byte local_28 [8];
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_20;
  
  if (((context->client->config).enable_caching_operators == true) &&
     ((context->pipeline).ptr != (Pipeline *)0x0)) {
    this = &context->pipeline;
    pPVar2 = optional_ptr<duckdb::Pipeline,_true>::operator->(this);
    if ((pPVar2->sink).ptr != (PhysicalOperator *)0x0) {
      pPVar2 = optional_ptr<duckdb::Pipeline,_true>::operator->(this);
      bVar1 = Pipeline::IsOrderDependent(pPVar2);
      if (!bVar1) {
        pPVar2 = optional_ptr<duckdb::Pipeline,_true>::operator->(this);
        local_30.ptr = (pPVar2->sink).ptr;
        pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&local_30);
        (*pPVar3->_vptr_PhysicalOperator[0x23])(local_28,pPVar3);
        ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_20)
        ;
        return (bool)((local_28[0] ^ 1) &
                     local_20._M_impl.super__Vector_impl_data._M_start ==
                     local_20._M_impl.super__Vector_impl_data._M_finish);
      }
    }
  }
  return false;
}

Assistant:

bool PhysicalOperator::OperatorCachingAllowed(ExecutionContext &context) {
	if (!context.client.config.enable_caching_operators) {
		return false;
	} else if (!context.pipeline) {
		return false;
	} else if (!context.pipeline->GetSink()) {
		return false;
	} else if (context.pipeline->IsOrderDependent()) {
		return false;
	} else {
		auto partition_info = context.pipeline->GetSink()->RequiredPartitionInfo();
		if (partition_info.AnyRequired()) {
			return false;
		}
	}

	return true;
}